

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O2

Map * __thiscall World::GetMap(World *this,short id)

{
  reference ppMVar1;
  undefined6 in_register_00000032;
  
  ppMVar1 = std::vector<Map_*,_std::allocator<Map_*>_>::at
                      (&this->maps,(long)((int)CONCAT62(in_register_00000032,id) + -1));
  return *ppMVar1;
}

Assistant:

Map *World::GetMap(short id)
{
	try
	{
		return this->maps.at(id - 1);
	}
	catch (...)
	{
		try
		{
			return this->maps.at(0);
		}
		catch (...)
		{
			throw std::runtime_error("Map #" + util::to_string(id) + " and fallback map #1 are unavailable");
		}
	}
}